

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweeper_kba_c_kernels.h
# Opt level: O1

void Sweeper_sweep_block_impl
               (SweeperLite sweeper,P *vo,P *vi,P *facexy,P *facexz,P *faceyz,P *a_from_m,
               P *m_from_a,int step,Quantities quan,Bool_t proc_x_min,Bool_t proc_x_max,
               Bool_t proc_y_min,Bool_t proc_y_max,StepInfoAll stepinfoall,
               unsigned_long do_block_init)

{
  P *v;
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  double *pdVar21;
  ulong uVar22;
  P *pPVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  int iVar37;
  uint uVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  double dVar42;
  P *pPVar43;
  byte bVar44;
  uint uVar45;
  int iVar46;
  uint uVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  uint uVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  long lVar60;
  int iVar61;
  ulong uVar62;
  int iVar63;
  int iVar64;
  uint uVar65;
  int iVar66;
  int iVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double *pdVar71;
  ulong uVar72;
  long lVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  ulong uVar77;
  uint uVar78;
  int iVar79;
  int iVar80;
  long lVar81;
  ulong uVar82;
  int iVar83;
  uint uVar84;
  int iVar85;
  int iVar86;
  long lVar87;
  int iVar88;
  int iVar89;
  uint uVar90;
  int iVar91;
  uint uVar92;
  ulong uVar93;
  long lVar94;
  ulong uVar95;
  bool bVar96;
  bool bVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  P PVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  int iz;
  undefined8 in_stack_fffffffffffffa80;
  int in_stack_fffffffffffffa88;
  uint local_540;
  uint local_53c;
  uint local_520;
  uint local_51c;
  ulong local_4e0;
  uint local_4c8;
  uint local_4c4;
  uint local_4c0;
  uint local_4bc;
  P *local_488;
  P *local_480;
  P *local_478;
  uint local_42c;
  uint local_428;
  uint local_424;
  uint local_420;
  uint local_41c;
  uint local_418;
  uint local_414;
  uint local_410;
  uint local_40c;
  uint local_408;
  uint local_404;
  uint local_400;
  uint local_3fc;
  uint local_3f8;
  uint local_3f4;
  uint local_3f0;
  uint local_3ec;
  uint local_3e8;
  uint local_3e4;
  uint local_3e0;
  uint local_3dc;
  uint local_3d8;
  uint local_3d4;
  uint local_3d0;
  uint local_3cc;
  uint local_3c8;
  uint local_3c4;
  uint local_3c0;
  uint local_3bc;
  uint local_3b8;
  uint local_3b4;
  uint local_3b0;
  uint local_3ac;
  double *local_178;
  P *local_168;
  P *local_160;
  P *local_158;
  P *local_150;
  P *local_148;
  P *local_140;
  P *local_138;
  P *local_130;
  P *local_128;
  
  if (0 < (long)sweeper.nsemiblock) {
    iVar24 = (sweeper.dims_b.ncell_x - (sweeper.dims_b.ncell_x + 1 >> 0x1f)) + 1 >> 1;
    iVar25 = (sweeper.dims_b.ncell_y - (sweeper.dims_b.ncell_y + 1 >> 0x1f)) + 1 >> 1;
    iVar63 = (sweeper.dims_b.ncell_z - (sweeper.dims_b.ncell_z + 1 >> 0x1f)) + 1 >> 1;
    uVar93 = 0;
    if (0 < sweeper.dims_g.na) {
      uVar93 = (ulong)(uint)sweeper.dims_g.na;
    }
    lVar81 = (long)sweeper.noctant_per_block;
    uVar95 = (ulong)(uint)sweeper.dims_b.na;
    lVar94 = (long)sweeper.dims_b.nm;
    iVar6 = sweeper.dims_b.ne * sweeper.dims_b.ncell_y;
    iVar26 = sweeper.dims_b.ncell_y * sweeper.dims_b.ncell_x * sweeper.dims_b.na * 4;
    iVar88 = sweeper.dims_b.ne * sweeper.dims_b.ncell_z;
    iVar1 = sweeper.dims_b.ncell_x * sweeper.dims_b.na * 4;
    iVar27 = sweeper.dims_b.ncell_x * sweeper.dims_b.na * sweeper.dims_b.ncell_z * 4;
    iVar89 = sweeper.dims_b.ncell_y * sweeper.dims_b.na * sweeper.dims_b.ncell_z * 4;
    iVar7 = sweeper.dims_b.na * 4;
    lVar73 = 0;
    do {
      if (sweeper.nthread_y * sweeper.nthread_z * sweeper.nthread_octant * sweeper.nthread_e != 1) {
        __assert_fail("sweeper->nthread_e * sweeper->nthread_octant * sweeper->nthread_y * sweeper->nthread_z == 1 || Env_omp_in_parallel()"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/sweeper_kba_kernels.h"
                      ,0x8f,"int Sweeper_thread_octant(const SweeperLite *)");
      }
      if (0 < (int)((long)sweeper.noctant_per_block / (long)sweeper.nthread_octant)) {
        if (8 < (uint)sweeper.nsemiblock) {
          __assert_fail("nsemiblock >= 0 && nsemiblock <= NOCTANT",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/sweeper_kba_kernels.h"
                        ,0x193,"Bool_t is_axis_semiblocked(int, int)");
        }
        iVar41 = 0;
        iVar59 = 0;
        iVar58 = 0;
        iVar57 = 0;
        iVar40 = 0;
        uVar77 = 0;
        do {
          uVar3 = stepinfoall.stepinfo[uVar77].octant;
          uVar45 = uVar3 & 4;
          bVar44 = uVar45 == 0 ^ (byte)(((uint)lVar73 & 4) >> 2);
          iVar61 = sweeper.dims_b.ncell_z;
          if (bVar44 != 0) {
            iVar61 = iVar63;
          }
          if (sweeper.nsemiblock < 5) {
            iVar61 = sweeper.dims_b.ncell_z;
          }
          iVar28 = iVar61 + -1;
          if (((undefined1  [144])sweeper & (undefined1  [144])0x1) == (undefined1  [144])0x0) {
            iVar61 = iVar28;
          }
          iVar46 = iVar63;
          if (bVar44 != 0) {
            iVar46 = 0;
            iVar61 = iVar28;
          }
          if (sweeper.nsemiblock < 5) {
            iVar46 = 0;
            iVar61 = iVar28;
          }
          uVar47 = uVar3 & 2;
          bVar44 = uVar47 == 0 ^ (byte)(((uint)lVar73 & 2) >> 1);
          iVar28 = sweeper.dims_b.ncell_y;
          if (bVar44 != 0) {
            iVar28 = iVar25;
          }
          if (sweeper.nsemiblock < 3) {
            iVar28 = sweeper.dims_b.ncell_y;
          }
          iVar29 = iVar28 + -1;
          if (((undefined1  [144])sweeper & (undefined1  [144])0x100000000) ==
              (undefined1  [144])0x0) {
            iVar28 = iVar29;
          }
          iVar48 = iVar25;
          if (bVar44 != 0) {
            iVar48 = 0;
            iVar28 = iVar29;
          }
          if (sweeper.nsemiblock < 3) {
            iVar48 = 0;
            iVar28 = iVar29;
          }
          uVar30 = uVar3 & 1;
          bVar44 = uVar30 == 0 ^ (byte)lVar73;
          iVar29 = sweeper.dims_b.ncell_x;
          if ((bVar44 & 1) != 0) {
            iVar29 = iVar24;
          }
          if (sweeper.nsemiblock == 1) {
            iVar29 = sweeper.dims_b.ncell_x;
          }
          iVar49 = iVar29 + -1;
          if (((undefined1  [144])sweeper & (undefined1  [144])0x1) == (undefined1  [144])0x0) {
            iVar29 = iVar49;
          }
          iVar31 = iVar24;
          if ((bVar44 & 1) != 0) {
            iVar29 = iVar49;
            iVar31 = 0;
          }
          if (sweeper.nsemiblock == 1) {
            iVar31 = 0;
            iVar29 = iVar49;
          }
          if (vi == (P *)0x0) {
            __assert_fail("v",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                          ,0xc3,
                          "const P *const_ref_state(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                         );
          }
          if (sweeper.dims.ncell_x < 1) {
            __assert_fail("ix >= 0 && ix < dims.ncell_x",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                          ,0xc5,
                          "const P *const_ref_state(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                         );
          }
          if (sweeper.dims.ncell_y < 1) {
            __assert_fail("iy >= 0 && iy < dims.ncell_y",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                          ,0xc6,
                          "const P *const_ref_state(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                         );
          }
          iVar49 = stepinfoall.stepinfo[uVar77].block_z * sweeper.dims_b.ncell_z;
          if ((iVar49 < 0) || (sweeper.dims.ncell_z <= iVar49)) {
            __assert_fail("iz >= 0 && iz < dims.ncell_z",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                          ,199,
                          "const P *const_ref_state(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                         );
          }
          if (sweeper.dims.ne < 1) {
            __assert_fail("ie >= 0 && ie < dims.ne",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                          ,200,
                          "const P *const_ref_state(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                         );
          }
          if (sweeper.dims.nm < 1) {
            __assert_fail("im >= 0 && im < dims.nm",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                          ,0xc9,
                          "const P *const_ref_state(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                         );
          }
          if (vo == (P *)0x0) {
            __assert_fail("v",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                          ,0x89,
                          "P *ref_state(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
                         );
          }
          if (sweeper.ncell_x_per_subblock < 1) {
LAB_00108f43:
            __assert_fail("j > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/definitions_kernels.h"
                          ,0x57,"int iceil(const int, const int)");
          }
          iVar4 = stepinfoall.stepinfo[uVar77].is_active;
          uVar8 = iVar29 - iVar31;
          if ((int)uVar8 < 0) {
            uVar8 = ~uVar8 / (uint)sweeper.ncell_x_per_subblock;
          }
          else {
            uVar8 = (int)-(uVar8 + sweeper.ncell_x_per_subblock) / sweeper.ncell_x_per_subblock;
          }
          if (sweeper.ncell_y_per_subblock < 1) goto LAB_00108f43;
          uVar9 = iVar28 - iVar48;
          if ((int)uVar9 < 0) {
            uVar9 = ~uVar9 / (uint)sweeper.ncell_y_per_subblock;
          }
          else {
            uVar9 = (int)-(uVar9 + sweeper.ncell_y_per_subblock) / sweeper.ncell_y_per_subblock;
          }
          if (sweeper.ncell_z_per_subblock < 1) goto LAB_00108f43;
          uVar10 = iVar61 - iVar46;
          if ((int)uVar10 < 0) {
            uVar10 = ~uVar10 / (uint)sweeper.ncell_z_per_subblock;
          }
          else {
            uVar10 = (int)-(uVar10 + sweeper.ncell_z_per_subblock) / sweeper.ncell_z_per_subblock;
          }
          if ((-1 < (int)uVar8) || (sweeper.nthread_y < 1)) goto LAB_00108f43;
          if ((int)uVar9 < 0) {
            uVar11 = (int)((uVar9 - sweeper.nthread_y) + 1) / sweeper.nthread_y;
          }
          else {
            uVar11 = uVar9 / (uint)sweeper.nthread_y;
          }
          if (sweeper.nthread_z < 1) goto LAB_00108f43;
          if ((int)uVar10 < 0) {
            uVar12 = (int)((uVar10 - sweeper.nthread_z) + 1) / sweeper.nthread_z;
          }
          else {
            uVar12 = uVar10 / (uint)sweeper.nthread_z;
          }
          if (-1 < (int)uVar11) goto LAB_00108f43;
          uVar8 = -uVar8;
          iVar32 = -uVar11;
          iVar13 = (int)((uVar11 - sweeper.nthread_z) + 1) / iVar32;
          uVar14 = -iVar13;
          if (sweeper.nthread_y != uVar14 &&
              SBORROW4(sweeper.nthread_y,uVar14) == sweeper.nthread_y + iVar13 < 0) {
            uVar14 = sweeper.nthread_y;
          }
          if ((int)uVar14 < (int)uVar8) {
            uVar14 = uVar8;
          }
          iVar13 = uVar14 * uVar12 * uVar11;
          uVar15 = sweeper.nthread_y + -2 + sweeper.nthread_z + iVar13;
          if (0 < (int)uVar15) {
            uVar90 = -uVar30 | 1;
            uVar84 = -(uint)((uVar3 >> 1 & 1) != 0) | 1;
            uVar78 = -(uint)((uVar3 >> 2 & 1) != 0) | 1;
            uVar20 = (ulong)(uint)(iVar49 * sweeper.dims.ne * sweeper.dims.nm *
                                            sweeper.dims.ncell_x * sweeper.dims.ncell_y * 4);
            iVar64 = sweeper.nthread_y + -1;
            if (uVar47 == 0) {
              iVar64 = 0;
            }
            iVar50 = sweeper.nthread_z + -1;
            if (uVar45 == 0) {
              iVar50 = 0;
            }
            v = vo + uVar20;
            dVar112 = (double)(int)(uVar3 + 1);
            local_4bc = 0;
            dVar98 = 1.0 / dVar112;
            iVar51 = iVar1 * uVar84;
            iVar74 = iVar7 * uVar90;
            iVar33 = iVar1 * uVar78;
            iVar34 = sweeper.dims_b.ncell_y * sweeper.dims_b.na * 4 * uVar78;
            iVar52 = iVar7 * uVar84;
            do {
              uVar55 = ~local_4bc + iVar13;
              if (uVar30 == 0) {
                uVar55 = local_4bc;
              }
              iVar53 = (int)uVar55 % (int)uVar14;
              bVar5 = false;
              uVar16 = local_4bc / uVar14;
              uVar65 = ~uVar16 + uVar12 * uVar11;
              uVar55 = uVar65;
              if (uVar45 == 0) {
                uVar55 = uVar16;
              }
              if (uVar47 == 0) {
                uVar65 = uVar16;
              }
              iVar54 = ((int)uVar65 % iVar32) * sweeper.nthread_y + iVar64;
              iVar85 = ((int)uVar55 / iVar32) * sweeper.nthread_z + iVar50;
              if ((((((int)local_4bc < iVar13) && (-1 < iVar85)) && (iVar85 < (int)-uVar10)) &&
                  ((-1 < iVar54 && (-1 < iVar53)))) && (iVar54 < (int)-uVar9)) {
                bVar5 = iVar53 < (int)uVar8;
              }
              iVar35 = sweeper.ncell_x_per_subblock * iVar53 + iVar31;
              iVar83 = (iVar53 + 1) * sweeper.ncell_x_per_subblock + iVar31 + -1;
              iVar66 = sweeper.ncell_y_per_subblock * iVar54 + iVar48;
              iVar79 = (iVar54 + 1) * sweeper.ncell_y_per_subblock + iVar48 + -1;
              iVar54 = sweeper.ncell_z_per_subblock * iVar85 + iVar46;
              iVar86 = (iVar85 + 1) * sweeper.ncell_z_per_subblock + iVar46 + -1;
              iVar85 = sweeper.dims.ne / sweeper.nthread_e;
              iVar53 = iVar83;
              if (uVar30 != 0) {
                iVar53 = iVar35;
                iVar35 = iVar83;
              }
              iVar83 = iVar79;
              if (uVar47 != 0) {
                iVar83 = iVar66;
                iVar66 = iVar79;
              }
              iVar79 = iVar86;
              if (uVar45 != 0) {
                iVar79 = iVar54;
                iVar54 = iVar86;
              }
              if (0 < iVar85) {
                uVar55 = ((iVar40 + iVar66) * sweeper.dims_b.ncell_x + iVar35) * iVar7;
                uVar65 = ((iVar57 + iVar54) * sweeper.dims_b.ncell_x + iVar35) * iVar7;
                uVar16 = ((iVar58 + iVar54) * sweeper.dims_b.ncell_y + iVar66) * iVar7;
                iVar86 = 0;
                do {
                  uVar36 = iVar86 * 0x556 + 0x24d69;
                  if (iVar54 != iVar79 + uVar78) {
                    dVar42 = (double)(1 << ((char)uVar36 + (char)(uVar36 / 0xae529) * -0x29 & 3U));
                    local_520 = uVar16;
                    local_51c = uVar65;
                    iVar18 = iVar54;
                    do {
                      if (iVar66 != uVar84 + iVar83) {
                        iVar67 = iVar18 + iVar49;
                        iVar91 = iVar67 - uVar78;
                        local_540 = local_520;
                        iVar19 = iVar66;
                        uVar36 = uVar55;
                        do {
                          if (iVar35 != uVar90 + iVar53) {
                            iVar37 = quan.iy_base + iVar19;
                            iVar80 = iVar37 - uVar84;
                            iVar17 = iVar35;
                            uVar2 = local_51c;
                            uVar38 = uVar36;
                            do {
                              if (((iVar17 < sweeper.dims_b.ncell_x) &&
                                  (iVar19 < sweeper.dims_b.ncell_y)) &&
                                 (((iVar17 <= iVar29 && iVar19 <= iVar28) &&
                                  iVar18 < sweeper.dims_b.ncell_z) &&
                                  ((bVar5 && iVar4 != 0) && iVar18 <= iVar61))) {
                                if (iVar67 == sweeper.dims_g.ncell_z + -1 && uVar45 != 0 ||
                                    iVar67 == 0 && uVar45 == 0) {
                                  iVar75 = quan.ix_base + iVar17;
                                  lVar60 = 0;
                                  uVar92 = uVar38;
                                  do {
                                    if (0 < sweeper.dims_b.na) {
                                      if (sweeper.dims_g.ncell_x <= iVar75 || iVar75 < 0) {
                                        __assert_fail("ix_g >= 0 && ix_g < dims_g.ncell_x",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0xe6,
                                                  "P Quantities_init_facexy(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      if (sweeper.dims_g.ncell_y <= iVar37 || iVar37 < 0) {
                                        __assert_fail("iy_g >= 0 && iy_g < dims_g.ncell_y",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0xe7,
                                                  "P Quantities_init_facexy(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      if ((sweeper.dims_g.ncell_z != iVar91 || uVar45 == 0) &&
                                          (iVar91 != -1 || uVar45 != 0)) {
                                        __assert_fail(
                                                  "( iz_g == -1 && Dir_z(octant)==DIR_UP ) || ( iz_g == dims_g.ncell_z && Dir_z(octant)==DIR_DN )"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0xe9,
                                                  "P Quantities_init_facexy(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      if (sweeper.dims_g.ne <= iVar86) {
                                        __assert_fail("ie >= 0 && ie < dims_g.ne",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0xea,
                                                  "P Quantities_init_facexy(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      uVar62 = 0;
                                      do {
                                        if (uVar93 == uVar62) {
                                          __assert_fail("ia >= 0 && ia < dims_g.na",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0xeb,
                                                  "P Quantities_init_facexy(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                        }
                                        if (7 < uVar3) {
                                          __assert_fail("octant >= 0 && octant < NOCTANT",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0xed,
                                                  "P Quantities_init_facexy(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                        }
                                        if (quan.ncell_x_g < iVar75) goto LAB_001087e0;
                                        if (quan.ncell_y_g < iVar37) goto LAB_001087c1;
                                        if (quan.ncell_z_g < iVar91 || iVar91 < -1)
                                        goto LAB_001087ff;
                                        if (facexy == (P *)0x0) {
                                          __assert_fail("v",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x1d8,
                                                  "P *ref_facexy(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (iVar17 < 0) {
                                          __assert_fail("ix >= 0 && ix < dims.ncell_x",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x1da,
                                                  "P *ref_facexy(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (iVar19 < 0) {
                                          __assert_fail("iy >= 0 && iy < dims.ncell_y",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x1db,
                                                  "P *ref_facexy(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (sweeper.dims_b.ne <= iVar86) {
                                          __assert_fail("ie >= 0 && ie < dims.ne",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x1dc,
                                                  "P *ref_facexy(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (lVar81 <= (long)uVar77) {
                                          __assert_fail(
                                                  "octant_in_block >= 0 && octant_in_block < noctant_per_block"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x1df,
                                                  "P *ref_facexy(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        uVar82 = uVar62 + 1;
                                        facexy[uVar92 + uVar62] =
                                             (double)(1 << ((byte)uVar62 & 7)) * (double)(int)uVar82
                                             * (double)(1 << (((char)iVar91 + (char)iVar37) * '\x03'
                                                              + (char)iVar75 & 3U ^ 2)) * dVar42 *
                                             (double)(1 << ((char)lVar60 + 1U & 3)) * dVar112;
                                        uVar62 = uVar82;
                                      } while (uVar95 != uVar82);
                                    }
                                    lVar60 = lVar60 + 1;
                                    uVar92 = uVar92 + sweeper.dims_b.na;
                                  } while (lVar60 != 4);
                                }
                                if (iVar37 == sweeper.dims_g.ncell_y + -1 && uVar47 != 0 ||
                                    iVar37 == 0 && uVar47 == 0) {
                                  iVar75 = quan.ix_base + iVar17;
                                  lVar60 = 0;
                                  uVar92 = uVar2;
                                  do {
                                    if (0 < sweeper.dims_b.na) {
                                      if (sweeper.dims_g.ncell_x <= iVar75 || iVar75 < 0) {
                                        __assert_fail("ix_g >= 0 && ix_g < dims_g.ncell_x",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x110,
                                                  "P Quantities_init_facexz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      if ((sweeper.dims_g.ncell_y != iVar80 || uVar47 == 0) &&
                                          (iVar80 != -1 || uVar47 != 0)) {
                                        __assert_fail(
                                                  "( iy_g == -1 && Dir_y(octant)==DIR_UP ) || ( iy_g == dims_g.ncell_y && Dir_y(octant)==DIR_DN )"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x112,
                                                  "P Quantities_init_facexz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      if (sweeper.dims_g.ncell_z <= iVar67 || iVar67 < 0) {
                                        __assert_fail("iz_g >= 0 && iz_g < dims_g.ncell_z",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x113,
                                                  "P Quantities_init_facexz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      if (sweeper.dims_g.ne <= iVar86) {
                                        __assert_fail("ie >= 0 && ie < dims_g.ne",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x114,
                                                  "P Quantities_init_facexz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      uVar62 = 0;
                                      do {
                                        if (uVar93 == uVar62) {
                                          __assert_fail("ia >= 0 && ia < dims_g.na",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x115,
                                                  "P Quantities_init_facexz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                        }
                                        if (7 < uVar3) {
                                          __assert_fail("octant >= 0 && octant < NOCTANT",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x117,
                                                  "P Quantities_init_facexz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                        }
                                        if (quan.ncell_x_g < iVar75) goto LAB_001087e0;
                                        if (quan.ncell_y_g < iVar80 || iVar80 < -1)
                                        goto LAB_001087c1;
                                        if (quan.ncell_z_g < iVar67) goto LAB_001087ff;
                                        if (facexz == (P *)0x0) {
                                          __assert_fail("v",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x218,
                                                  "P *ref_facexz(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (iVar17 < 0) {
                                          __assert_fail("ix >= 0 && ix < dims.ncell_x",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x21a,
                                                  "P *ref_facexz(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (sweeper.dims_b.ncell_z <= iVar18 || iVar18 < 0) {
                                          __assert_fail("iz >= 0 && iz < dims.ncell_z",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x21b,
                                                  "P *ref_facexz(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (sweeper.dims_b.ne <= iVar86) {
                                          __assert_fail("ie >= 0 && ie < dims.ne",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x21c,
                                                  "P *ref_facexz(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (lVar81 <= (long)uVar77) {
                                          __assert_fail(
                                                  "octant_in_block >= 0 && octant_in_block < noctant_per_block"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x21f,
                                                  "P *ref_facexz(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        uVar82 = uVar62 + 1;
                                        facexz[uVar92 + uVar62] =
                                             (double)(1 << ((byte)uVar62 & 7)) * (double)(int)uVar82
                                             * (double)(1 << (((char)iVar80 + (char)iVar67) * '\x03'
                                                              + (char)iVar75 & 3U ^ 2)) * dVar42 *
                                             (double)(1 << ((char)lVar60 + 1U & 3)) * dVar112;
                                        uVar62 = uVar82;
                                      } while (uVar95 != uVar82);
                                    }
                                    lVar60 = lVar60 + 1;
                                    uVar92 = uVar92 + sweeper.dims_b.na;
                                  } while (lVar60 != 4);
                                }
                                iVar75 = quan.ix_base + iVar17;
                                if ((iVar75 == 0 && uVar30 == 0) ||
                                   (uVar30 != 0 && iVar75 == sweeper.dims_g.ncell_x + -1)) {
                                  iVar75 = iVar75 - uVar90;
                                  lVar60 = 0;
                                  uVar92 = local_540;
                                  do {
                                    if (0 < sweeper.dims_b.na) {
                                      if ((sweeper.dims_g.ncell_x != iVar75 || uVar30 == 0) &&
                                          (iVar75 != -1 || uVar30 != 0)) {
                                        __assert_fail(
                                                  "( ix_g == -1 && Dir_x(octant)==DIR_UP ) || ( ix_g == dims_g.ncell_x && Dir_x(octant)==DIR_DN )"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x137,
                                                  "P Quantities_init_faceyz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      if (sweeper.dims_g.ncell_y <= iVar37 || iVar37 < 0) {
                                        __assert_fail("iy_g >= 0 && iy_g < dims_g.ncell_y",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x138,
                                                  "P Quantities_init_faceyz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      if (sweeper.dims_g.ncell_z <= iVar67 || iVar67 < 0) {
                                        __assert_fail("iz_g >= 0 && iz_g < dims_g.ncell_z",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x139,
                                                  "P Quantities_init_faceyz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      if (sweeper.dims_g.ne <= iVar86) {
                                        __assert_fail("ie >= 0 && ie < dims_g.ne",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x13a,
                                                  "P Quantities_init_faceyz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                      }
                                      uVar62 = 0;
                                      do {
                                        if (uVar93 == uVar62) {
                                          __assert_fail("ia >= 0 && ia < dims_g.na",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x13b,
                                                  "P Quantities_init_faceyz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                        }
                                        if (7 < uVar3) {
                                          __assert_fail("octant >= 0 && octant < NOCTANT",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x13d,
                                                  "P Quantities_init_faceyz(const Quantities *, int, int, int, int, int, int, int, const Dimensions)"
                                                  );
                                        }
                                        if (quan.ncell_x_g < iVar75 || iVar75 < -1)
                                        goto LAB_001087e0;
                                        if (quan.ncell_y_g < iVar37) goto LAB_001087c1;
                                        if (quan.ncell_z_g < iVar67) goto LAB_001087ff;
                                        if (faceyz == (P *)0x0) {
                                          __assert_fail("v",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,600,
                                                  "P *ref_faceyz(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (iVar19 < 0) {
                                          __assert_fail("iy >= 0 && iy < dims.ncell_y",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x25a,
                                                  "P *ref_faceyz(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (sweeper.dims_b.ncell_z <= iVar18 || iVar18 < 0) {
                                          __assert_fail("iz >= 0 && iz < dims.ncell_z",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x25b,
                                                  "P *ref_faceyz(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (sweeper.dims_b.ne <= iVar86) {
                                          __assert_fail("ie >= 0 && ie < dims.ne",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x25c,
                                                  "P *ref_faceyz(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (lVar81 <= (long)uVar77) {
                                          __assert_fail(
                                                  "octant_in_block >= 0 && octant_in_block < noctant_per_block"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x25f,
                                                  "P *ref_faceyz(P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        uVar82 = uVar62 + 1;
                                        faceyz[uVar92 + uVar62] =
                                             (double)(1 << ((byte)uVar62 & 7)) * (double)(int)uVar82
                                             * (double)(1 << (((char)iVar37 + (char)iVar67) * '\x03'
                                                              + (char)iVar75 & 3U ^ 2)) * dVar42 *
                                             (double)(1 << ((char)lVar60 + 1U & 3)) * dVar112;
                                        uVar62 = uVar82;
                                      } while (uVar95 != uVar82);
                                    }
                                    lVar60 = lVar60 + 1;
                                    uVar92 = uVar92 + sweeper.dims_b.na;
                                  } while (lVar60 != 4);
                                }
                              }
                              uVar38 = uVar38 + iVar74;
                              uVar2 = uVar2 + iVar74;
                              bVar96 = iVar17 != iVar53;
                              iVar17 = uVar90 + iVar17;
                            } while (bVar96);
                          }
                          uVar36 = uVar36 + iVar51;
                          local_540 = local_540 + iVar52;
                          bVar96 = iVar19 != iVar83;
                          iVar19 = uVar84 + iVar19;
                        } while (bVar96);
                      }
                      local_51c = local_51c + iVar33;
                      local_520 = local_520 + iVar34;
                      bVar96 = iVar18 != iVar79;
                      iVar18 = uVar78 + iVar18;
                    } while (bVar96);
                  }
                  iVar86 = iVar86 + 1;
                  uVar55 = uVar55 + iVar26;
                  uVar65 = uVar65 + iVar27;
                  uVar16 = uVar16 + iVar89;
                } while (iVar85 != iVar86);
              }
              if (0 < iVar85) {
                local_4c8 = ((iVar6 * iVar54 + iVar66) * sweeper.dims_b.ncell_x + iVar35) * 0x40;
                iVar86 = sweeper.dims_b.ncell_y * (iVar54 + iVar59) + iVar66;
                local_418 = (iVar86 * 4 + 3) * sweeper.dims_b.na;
                local_41c = (iVar86 * 4 + 2) * sweeper.dims_b.na;
                local_420 = (iVar86 * 4 + 1) * sweeper.dims_b.na;
                uVar55 = iVar86 * iVar7;
                iVar86 = (iVar54 + iVar59) * sweeper.dims_b.ncell_x + iVar35;
                local_424 = (iVar86 * 4 + 3) * sweeper.dims_b.na;
                local_428 = (iVar86 * 4 + 2) * sweeper.dims_b.na;
                local_42c = (iVar86 * 4 + 1) * sweeper.dims_b.na;
                uVar65 = iVar86 * iVar7;
                iVar86 = (iVar41 + iVar66) * sweeper.dims_b.ncell_x + iVar35;
                local_40c = (iVar86 * 4 + 3) * sweeper.dims_b.na;
                local_410 = (iVar86 * 4 + 2) * sweeper.dims_b.na;
                local_414 = (iVar86 * 4 + 1) * sweeper.dims_b.na;
                uVar16 = iVar86 * iVar7;
                iVar86 = 0;
                do {
                  if (iVar54 != iVar79 + uVar78) {
                    local_3f0 = local_42c;
                    local_3f4 = local_428;
                    local_3f8 = local_424;
                    local_400 = local_420;
                    local_404 = local_41c;
                    local_408 = local_418;
                    local_4c4 = local_4c8;
                    local_3fc = uVar55;
                    local_3ec = uVar65;
                    iVar18 = iVar54;
                    do {
                      if (iVar66 != uVar84 + iVar83) {
                        iVar91 = iVar18 + iVar49;
                        iVar67 = (-(uint)(uVar3 < 4) | 1) + iVar91;
                        local_3d0 = local_414;
                        local_3d4 = local_410;
                        local_3d8 = local_40c;
                        local_3dc = local_3fc;
                        local_3e0 = local_400;
                        local_3e4 = local_404;
                        local_3e8 = local_408;
                        local_4c0 = local_4c4;
                        local_3cc = uVar16;
                        iVar19 = iVar66;
                        do {
                          if (iVar35 != uVar90 + iVar53) {
                            iVar75 = quan.iy_base + iVar19;
                            iVar17 = (iVar75 + iVar91) * 3;
                            iVar37 = (uint)(uVar47 != 0) * 2 + -1 + iVar75;
                            local_3ac = local_3cc;
                            local_3b0 = local_3d0;
                            local_3b4 = local_3d4;
                            local_3b8 = local_3d8;
                            local_3bc = local_3ec;
                            local_3c0 = local_3f0;
                            local_3c4 = local_3f4;
                            local_3c8 = local_3f8;
                            iVar80 = iVar35;
                            uVar36 = local_4c0;
                            do {
                              local_4e0 = (ulong)uVar36;
                              bVar96 = false;
                              if ((iVar80 < sweeper.dims_b.ncell_x) &&
                                 (iVar19 < sweeper.dims_b.ncell_y)) {
                                bVar96 = (bool)((iVar80 <= iVar29 && iVar18 < sweeper.dims_b.ncell_z
                                                ) & iVar4 != 0 & bVar5 & iVar18 <= iVar61 &
                                               iVar19 <= iVar28);
                              }
                              if (0 < sweeper.dims_b.na) {
                                local_478 = facexz + local_3c8;
                                local_480 = facexz + local_3c4;
                                local_488 = facexz + local_3c0;
                                local_128 = facexz + local_3bc;
                                local_130 = facexy + local_3b8;
                                local_138 = facexy + local_3b4;
                                iVar76 = quan.ix_base + iVar80;
                                uVar38 = iVar17 + iVar76 & 3U ^ 2;
                                local_140 = facexy + local_3b0;
                                dVar99 = (double)(1 << (sbyte)uVar38);
                                dVar42 = (double)(((ulong)uVar38 ^ 0x3ff) << 0x34);
                                iVar56 = iVar76 + (-(uint)(uVar30 == 0) | 1);
                                dVar68 = (double)(((ulong)(iVar17 + iVar56 & 3U ^ 2) ^ 0x3ff) <<
                                                 0x34);
                                dVar69 = (double)(((ulong)((iVar91 + iVar37) * 3 + iVar76 & 3U ^ 2)
                                                  ^ 0x3ff) << 0x34);
                                dVar70 = (double)(((ulong)((iVar67 + iVar75) * 3 + iVar76 & 3U ^ 2)
                                                  ^ 0x3ff) << 0x34);
                                local_148 = facexy + local_3ac;
                                uVar62 = 0;
                                local_53c = sweeper.dims_b.na * 0x10 * uVar3;
                                local_178 = (double *)
                                            ((ulong)(uVar3 << 4) * uVar95 * 8 + (long)a_from_m);
                                local_168 = faceyz + local_3e8;
                                local_160 = faceyz + local_3e4;
                                local_158 = faceyz + local_3e0;
                                local_150 = faceyz + local_3dc;
                                do {
                                  pPVar43 = vi + uVar20 + local_4e0;
                                  pPVar23 = sweeper.vilocal_host_;
                                  lVar60 = 0;
                                  do {
                                    uVar82 = lVar60 << 4 | 0x20;
                                    lVar87 = 0;
                                    do {
                                      if ((bool)(uVar62 == 0 & bVar96)) {
                                        if (iVar80 < 0 || sweeper.dims_b.ncell_x <= iVar80) {
                                          __assert_fail("ix >= 0 && ix < dims_ncell_x",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0xa9,
                                                  "const P *const_ref_state_flat(const P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (sweeper.dims_b.ncell_y <= iVar19 || iVar19 < 0) {
                                          __assert_fail("iy >= 0 && iy < dims_ncell_y",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0xaa,
                                                  "const P *const_ref_state_flat(const P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (sweeper.dims_b.ncell_z <= iVar18 || iVar18 < 0) {
                                          __assert_fail("iz >= 0 && iz < dims_ncell_z",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0xab,
                                                  "const P *const_ref_state_flat(const P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (sweeper.dims_b.ne <= iVar86) {
                                          __assert_fail("ie >= 0 && ie < dims_ne",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0xac,
                                                  "const P *const_ref_state_flat(const P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                        }
                                        if (sweeper.vilocal_host_ == (P *)0x0) {
                                          __assert_fail("v",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0xda,
                                                  "P *ref_vilocal(P *const restrict, const Dimensions, const int, const int, const int, const int)"
                                                  );
                                        }
                                        *(undefined8 *)((long)pPVar23 + lVar87) =
                                             *(undefined8 *)((long)pPVar43 + lVar87);
                                        *(undefined8 *)
                                         ((long)sweeper.vilocal_host_ + lVar87 + uVar82 * 8) =
                                             *(undefined8 *)
                                              ((long)vi +
                                              lVar87 + (uVar82 + local_4e0) * 8 + uVar20 * 8);
                                      }
                                      lVar87 = lVar87 + 8;
                                    } while (lVar87 != 0x80);
                                    pPVar23 = pPVar23 + 0x10;
                                    pPVar43 = pPVar43 + 0x10;
                                    bVar97 = lVar60 == 0;
                                    lVar60 = lVar60 + 1;
                                  } while (bVar97);
                                  uVar82 = 0;
                                  pdVar21 = local_178;
                                  do {
                                    if ((uVar82 | uVar62) < uVar95 && bVar96) {
                                      if (a_from_m == (P *)0x0) {
                                        __assert_fail("v",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x180,
                                                  "const P *restrict const_ref_a_from_m_flat(const P *const restrict, const int, const int, const int, const int, const int)"
                                                  );
                                      }
                                      if (7 < uVar3) {
                                        __assert_fail("octant >= 0 && octant < NOCTANT",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x183,
                                                  "const P *restrict const_ref_a_from_m_flat(const P *const restrict, const int, const int, const int, const int, const int)"
                                                  );
                                      }
                                      if (sweeper.vilocal_host_ == (P *)0x0) {
                                        __assert_fail("v",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0xef,
                                                  "const P *const_ref_vilocal(const P *const restrict, const Dimensions, const int, const int, const int, const int)"
                                                  );
                                      }
                                      dVar100 = 0.0;
                                      lVar60 = -0x80;
                                      dVar102 = 0.0;
                                      dVar103 = 0.0;
                                      dVar105 = 0.0;
                                      pdVar71 = pdVar21;
                                      do {
                                        dVar104 = *pdVar71;
                                        dVar100 = dVar100 + *(double *)
                                                             ((long)sweeper.vilocal_host_ +
                                                             lVar60 + 0x80) * dVar104;
                                        dVar102 = dVar102 + *(double *)
                                                             ((long)sweeper.vilocal_host_ +
                                                             lVar60 + 0x100) * dVar104;
                                        dVar103 = dVar103 + *(double *)
                                                             ((long)sweeper.vilocal_host_ +
                                                             lVar60 + 0x180) * dVar104;
                                        dVar105 = dVar105 + dVar104 * *(double *)
                                                                       ((long)sweeper.vilocal_host_
                                                                       + lVar60 + 0x200);
                                        pdVar71 = pdVar71 + uVar95;
                                        lVar60 = lVar60 + 8;
                                      } while (lVar60 != 0);
                                      sweeper.vslocal_host_[uVar82] = dVar100;
                                      sweeper.vslocal_host_[uVar82 + 0x20] = dVar102;
                                      sweeper.vslocal_host_[uVar82 + 0x40] = dVar103;
                                      sweeper.vslocal_host_[uVar82 + 0x60] = dVar105;
                                    }
                                    uVar82 = uVar82 + 1;
                                    pdVar21 = pdVar21 + 1;
                                  } while (uVar82 != 0x20);
                                  lVar60 = 0;
                                  do {
                                    if (sweeper.vslocal_host_ == (P *)0x0) {
                                      __assert_fail("vslocal",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x168,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                    }
                                    if (facexy == (P *)0x0) {
                                      __assert_fail("facexy",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x16f,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                    }
                                    if (facexz == (P *)0x0) {
                                      __assert_fail("facexz",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x170,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                    }
                                    if (faceyz == (P *)0x0) {
                                      __assert_fail("faceyz",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x171,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                    }
                                    if (iVar80 < 0) {
                                      if (bVar96) goto LAB_00108d91;
                                    }
                                    else if ((bool)(sweeper.dims_b.ncell_x <= iVar80 & bVar96)) {
LAB_00108d91:
                                      __assert_fail(
                                                  "( ix_b >= 0 && ix_b < dims_b.ncell_x ) || ! is_cell_active"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x172,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                    }
                                    if (iVar19 < 0) {
                                      if (bVar96) goto LAB_00108cd7;
                                    }
                                    else if ((bool)(sweeper.dims_b.ncell_y <= iVar19 & bVar96)) {
LAB_00108cd7:
                                      __assert_fail(
                                                  "( iy_b >= 0 && iy_b < dims_b.ncell_y ) || ! is_cell_active"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x173,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                    }
                                    if (iVar18 < 0) {
                                      if (bVar96) goto LAB_00108db0;
                                    }
                                    else if ((bool)(sweeper.dims_b.ncell_z <= iVar18 & bVar96)) {
LAB_00108db0:
                                      __assert_fail(
                                                  "( iz_b >= 0 && iz_b < dims_b.ncell_z ) || ! is_cell_active"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x174,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                    }
                                    if (iVar76 < 0) {
                                      if (bVar96) goto LAB_00108dcf;
                                    }
                                    else if ((bool)(sweeper.dims_g.ncell_x <= iVar76 & bVar96)) {
LAB_00108dcf:
                                      __assert_fail(
                                                  "( ix_g >= 0 && ix_g < dims_g.ncell_x ) || ! is_cell_active"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x175,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                    }
                                    if (iVar75 < 0) {
                                      if (bVar96) goto LAB_00108dee;
                                    }
                                    else if ((bool)(sweeper.dims_g.ncell_y <= iVar75 & bVar96)) {
LAB_00108dee:
                                      __assert_fail(
                                                  "( iy_g >= 0 && iy_g < dims_g.ncell_y ) || ! is_cell_active"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x176,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                    }
                                    if (iVar91 < 0) {
                                      if (bVar96) goto LAB_00108cf6;
                                    }
                                    else if ((bool)(sweeper.dims_g.ncell_z <= iVar91 & bVar96)) {
LAB_00108cf6:
                                      __assert_fail(
                                                  "( iz_g >= 0 && iz_g < dims_g.ncell_z ) || ! is_cell_active"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x177,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                    }
                                    if (sweeper.dims_b.ne <= iVar86) {
                                      __assert_fail("ie >= 0 && ie < dims_b.ne",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x178,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                    }
                                    if (7 < uVar3) {
                                      __assert_fail("octant >= 0 && octant < NOCTANT",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x179,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                    }
                                    if (lVar81 <= (long)uVar77) {
                                      __assert_fail(
                                                  "octant_in_block >= 0 && octant_in_block < noctant_per_block"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x17a,
                                                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                                                  );
                                    }
                                    if ((bVar96) && (uVar62 + lVar60 < uVar95)) {
                                      if (quan.ncell_x_g < iVar76 || iVar76 < -1) {
LAB_001087e0:
                                        __assert_fail("ix_g >= -1 && ix_g <= quan->ncell_x_g",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x69,
                                                  "int Quantities_scalefactor_space_(const Quantities *, int, int, int)"
                                                  );
                                      }
                                      if (quan.ncell_y_g < iVar75 || iVar75 < -1) {
LAB_001087c1:
                                        __assert_fail("iy_g >= -1 && iy_g <= quan->ncell_y_g",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x6a,
                                                  "int Quantities_scalefactor_space_(const Quantities *, int, int, int)"
                                                  );
                                      }
                                      if (quan.ncell_z_g < iVar91 || iVar91 < -1) {
LAB_001087ff:
                                        __assert_fail("iz_g >= -1 && iz_g <= quan->ncell_z_g",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x6b,
                                                  "int Quantities_scalefactor_space_(const Quantities *, int, int, int)"
                                                  );
                                      }
                                      if (quan.ncell_x_g < iVar56 || iVar56 < -1) goto LAB_001087e0;
                                      if (quan.ncell_y_g < iVar37 || iVar37 < -1) goto LAB_001087c1;
                                      if (quan.ncell_z_g < iVar67 || iVar67 < -1) goto LAB_001087ff;
                                      dVar100 = (double)(((ulong)((uint)lVar60 & 7) ^
                                                         0xfffffffffffffbff) << 0x34) + 0.25;
                                      if (iVar80 < 0 || sweeper.dims_b.ncell_x <= iVar80) {
                                        __assert_fail("ix >= 0 && ix < dims.ncell_x",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x1fa,
                                                  "const P *const_ref_facexy(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                      }
                                      if (sweeper.dims_b.ncell_y <= iVar19 || iVar19 < 0) {
                                        __assert_fail("iy >= 0 && iy < dims.ncell_y",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x1fb,
                                                  "const P *const_ref_facexy(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                      }
                                      if ((long)sweeper.dims_g.na <= (long)(uVar62 + lVar60)) {
                                        __assert_fail("ia >= 0 && ia < dims.na",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                                                  ,0x96,"P Quantities_xfluxweight_(Dimensions, int)"
                                                  );
                                      }
                                      if (sweeper.dims_b.ncell_z <= iVar18 || iVar18 < 0) {
                                        __assert_fail("iz >= 0 && iz < dims.ncell_z",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x23b,
                                                  "const P *const_ref_facexz(const P *const restrict, const Dimensions, const int, const int, const int, const int, const int, const int, const int, const int)"
                                                  );
                                      }
                                      dVar102 = (sweeper.vslocal_host_[lVar60] * dVar42 +
                                                (local_150[lVar60] * dVar100 * dVar68 +
                                                local_148[lVar60] * 0.5 * dVar70 +
                                                local_128[lVar60] * 0.25 * dVar69) * dVar98) *
                                                dVar99;
                                      sweeper.vslocal_host_[lVar60] = dVar102;
                                      dVar102 = dVar102 * dVar112;
                                      local_148[lVar60] = dVar102;
                                      local_128[lVar60] = dVar102;
                                      local_150[lVar60] = dVar102;
                                      dVar102 = (sweeper.vslocal_host_[lVar60 + 0x20] * dVar42 +
                                                (local_158[lVar60] * dVar100 * dVar68 +
                                                local_140[lVar60] * 0.5 * dVar70 +
                                                local_488[lVar60] * 0.25 * dVar69) * dVar98) *
                                                dVar99;
                                      sweeper.vslocal_host_[lVar60 + 0x20] = dVar102;
                                      dVar102 = dVar102 * dVar112;
                                      local_140[lVar60] = dVar102;
                                      local_488[lVar60] = dVar102;
                                      local_158[lVar60] = dVar102;
                                      dVar102 = (sweeper.vslocal_host_[lVar60 + 0x40] * dVar42 +
                                                (local_160[lVar60] * dVar100 * dVar68 +
                                                local_138[lVar60] * 0.5 * dVar70 +
                                                local_480[lVar60] * 0.25 * dVar69) * dVar98) *
                                                dVar99;
                                      sweeper.vslocal_host_[lVar60 + 0x40] = dVar102;
                                      dVar102 = dVar102 * dVar112;
                                      local_138[lVar60] = dVar102;
                                      local_480[lVar60] = dVar102;
                                      local_160[lVar60] = dVar102;
                                      dVar100 = (sweeper.vslocal_host_[lVar60 + 0x60] * dVar42 +
                                                (dVar100 * local_168[lVar60] * dVar68 +
                                                local_130[lVar60] * 0.5 * dVar70 +
                                                local_478[lVar60] * 0.25 * dVar69) * dVar98) *
                                                dVar99;
                                      sweeper.vslocal_host_[lVar60 + 0x60] = dVar100;
                                      dVar100 = dVar100 * dVar112;
                                      local_130[lVar60] = dVar100;
                                      local_478[lVar60] = dVar100;
                                      local_168[lVar60] = dVar100;
                                    }
                                    lVar60 = lVar60 + 1;
                                  } while (lVar60 != 0x20);
                                  iVar39 = (int)(uVar62 + 0x20);
                                  uVar82 = 0;
                                  pPVar43 = sweeper.vslocal_host_ + 0x43;
                                  do {
                                    uVar22 = uVar82 | 2;
                                    lVar60 = 0;
                                    do {
                                      if (bVar96) {
                                        dVar100 = 0.0;
                                        dVar102 = 0.0;
                                        lVar87 = 0;
                                        uVar38 = local_53c;
                                        do {
                                          dVar103 = 0.0;
                                          if (uVar62 + lVar87 < uVar95) {
                                            if (lVar94 <= lVar60) goto LAB_001087a2;
                                            dVar103 = m_from_a[lVar60 + (ulong)uVar38];
                                          }
                                          dVar104 = 0.0;
                                          dVar105 = 0.0;
                                          if (uVar62 + lVar87 < uVar95) {
                                            dVar105 = pPVar43[lVar87 + -0x43] * dVar103;
                                            dVar104 = dVar103 * pPVar43[lVar87 + -3];
                                          }
                                          uVar72 = uVar62 + lVar87 + 1;
                                          dVar106 = 0.0;
                                          dVar103 = 0.0;
                                          if (uVar72 < uVar95) {
                                            if (lVar94 <= lVar60) goto LAB_001087a2;
                                            dVar103 = m_from_a[lVar60 + (ulong)(uVar38 + 0x10)];
                                          }
                                          if (uVar72 < uVar95) {
                                            dVar106 = pPVar43[lVar87 + -0x42] * dVar103;
                                          }
                                          dVar109 = 0.0;
                                          dVar107 = 0.0;
                                          if (uVar72 < uVar95) {
                                            dVar107 = dVar103 * pPVar43[lVar87 + -2];
                                          }
                                          uVar72 = uVar62 + lVar87 + 2;
                                          if (uVar72 < uVar95) {
                                            if (lVar94 <= lVar60) goto LAB_001087a2;
                                            dVar109 = m_from_a[lVar60 + (ulong)(uVar38 + 0x20)];
                                          }
                                          dVar108 = 0.0;
                                          dVar103 = 0.0;
                                          if (uVar72 < uVar95) {
                                            dVar103 = pPVar43[lVar87 + -0x41] * dVar109;
                                            dVar108 = dVar109 * pPVar43[lVar87 + -1];
                                          }
                                          uVar72 = uVar62 + lVar87 + 3;
                                          dVar110 = 0.0;
                                          dVar109 = 0.0;
                                          if (uVar72 < uVar95) {
                                            if (lVar94 <= lVar60) {
LAB_001087a2:
                                              __assert_fail("im >= 0 && im < dims_nm",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x1bf,
                                                  "int ind_m_from_a_flat(const int, const int, const int, const int, const int)"
                                                  );
                                            }
                                            dVar109 = m_from_a[lVar60 + (ulong)(uVar38 + 0x30)];
                                          }
                                          if (uVar72 < uVar95) {
                                            dVar110 = pPVar43[lVar87 + -0x40] * dVar109;
                                          }
                                          dVar111 = 0.0;
                                          if (uVar72 < uVar95) {
                                            dVar111 = dVar109 * pPVar43[lVar87];
                                          }
                                          dVar100 = dVar100 + dVar105 + dVar106 + dVar103 + dVar110;
                                          dVar102 = dVar102 + dVar104 + dVar107 + dVar108 + dVar111;
                                          lVar87 = lVar87 + 4;
                                          uVar38 = uVar38 + 0x40;
                                        } while (lVar87 != 0x20);
                                        if (uVar62 == 0) {
                                          if (sweeper.volocal_host_ == (P *)0x0) goto LAB_00108aa9;
                                          sweeper.volocal_host_[uVar82 * 0x10 + lVar60] = dVar100;
                                        }
                                        else {
                                          if (sweeper.volocal_host_ == (P *)0x0) goto LAB_00108aa9;
                                          sweeper.volocal_host_[uVar82 * 0x10 + lVar60] =
                                               dVar100 + sweeper.volocal_host_
                                                         [uVar82 * 0x10 + lVar60];
                                          dVar102 = dVar102 + sweeper.volocal_host_
                                                              [uVar82 * 0x10 + lVar60 + 0x20];
                                        }
                                        sweeper.volocal_host_[uVar82 * 0x10 + lVar60 + 0x20] =
                                             dVar102;
                                        if (sweeper.dims_b.na <= iVar39 && bVar96) {
                                          iz = (int)lVar60;
                                          if ((1L << ((byte)lVar73 * (char)sweeper.noctant_per_block
                                                      + (char)uVar77 & 0x3f) & do_block_init) == 0)
                                          {
                                            if (sweeper.volocal_host_ == (P *)0x0)
                                            goto LAB_00108aa9;
                                            dVar100 = sweeper.volocal_host_[uVar82 * 0x10 + lVar60];
                                            pPVar23 = ref_state_flat(v,sweeper.dims_b.ncell_x,
                                                                     sweeper.dims_b.ncell_y,
                                                                     sweeper.dims_b.ncell_z,
                                                                     sweeper.dims_b.ne,iVar80,iVar19
                                                                     ,iVar18,iVar86,iz,(int)uVar82,
                                                                     (int)in_stack_fffffffffffffa80,
                                                                     in_stack_fffffffffffffa88);
                                            *pPVar23 = dVar100 + *pPVar23;
                                            dVar100 = sweeper.volocal_host_[uVar22 * 0x10 + lVar60];
                                            pPVar23 = ref_state_flat(v,sweeper.dims_b.ncell_x,
                                                                     sweeper.dims_b.ncell_y,
                                                                     sweeper.dims_b.ncell_z,
                                                                     sweeper.dims_b.ne,iVar80,iVar19
                                                                     ,iVar18,iVar86,iz,(int)uVar22,
                                                                     (int)in_stack_fffffffffffffa80,
                                                                     in_stack_fffffffffffffa88);
                                            PVar101 = dVar100 + *pPVar23;
                                          }
                                          else {
                                            if (sweeper.volocal_host_ == (P *)0x0) {
LAB_00108aa9:
                                              __assert_fail("v",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                                                  ,0x141,
                                                  "P *ref_volocal(P *const restrict, const Dimensions, const int, const int, const int, const int)"
                                                  );
                                            }
                                            PVar101 = sweeper.volocal_host_[uVar82 * 0x10 + lVar60];
                                            pPVar23 = ref_state_flat(v,sweeper.dims_b.ncell_x,
                                                                     sweeper.dims_b.ncell_y,
                                                                     sweeper.dims_b.ncell_z,
                                                                     sweeper.dims_b.ne,iVar80,iVar19
                                                                     ,iVar18,iVar86,iz,(int)uVar82,
                                                                     (int)in_stack_fffffffffffffa80,
                                                                     in_stack_fffffffffffffa88);
                                            *pPVar23 = PVar101;
                                            PVar101 = sweeper.volocal_host_[uVar22 * 0x10 + lVar60];
                                            pPVar23 = ref_state_flat(v,sweeper.dims_b.ncell_x,
                                                                     sweeper.dims_b.ncell_y,
                                                                     sweeper.dims_b.ncell_z,
                                                                     sweeper.dims_b.ne,iVar80,iVar19
                                                                     ,iVar18,iVar86,iz,(int)uVar22,
                                                                     (int)in_stack_fffffffffffffa80,
                                                                     in_stack_fffffffffffffa88);
                                          }
                                          *pPVar23 = PVar101;
                                        }
                                      }
                                      lVar60 = lVar60 + 1;
                                    } while (lVar60 != 0x10);
                                    pPVar43 = pPVar43 + 0x20;
                                    bVar97 = uVar82 == 0;
                                    uVar82 = uVar82 + 1;
                                  } while (bVar97);
                                  local_178 = local_178 + 0x20;
                                  local_168 = local_168 + 0x20;
                                  local_160 = local_160 + 0x20;
                                  local_158 = local_158 + 0x20;
                                  local_150 = local_150 + 0x20;
                                  local_478 = local_478 + 0x20;
                                  local_480 = local_480 + 0x20;
                                  local_488 = local_488 + 0x20;
                                  local_128 = local_128 + 0x20;
                                  local_130 = local_130 + 0x20;
                                  local_138 = local_138 + 0x20;
                                  local_140 = local_140 + 0x20;
                                  local_148 = local_148 + 0x20;
                                  local_53c = local_53c + 0x200;
                                  uVar62 = uVar62 + 0x20;
                                } while (iVar39 < sweeper.dims_b.na);
                              }
                              uVar36 = uVar36 + uVar90 * 0x40;
                              local_3c8 = local_3c8 + iVar74;
                              local_3c4 = local_3c4 + iVar74;
                              local_3c0 = local_3c0 + iVar74;
                              local_3bc = local_3bc + iVar74;
                              local_3b8 = local_3b8 + iVar74;
                              local_3b4 = local_3b4 + iVar74;
                              local_3b0 = local_3b0 + iVar74;
                              local_3ac = local_3ac + iVar74;
                              bVar96 = iVar80 != iVar53;
                              iVar80 = uVar90 + iVar80;
                            } while (bVar96);
                          }
                          local_4c0 = local_4c0 + sweeper.dims_b.ncell_x * 0x40 * uVar84;
                          local_3e8 = local_3e8 + iVar52;
                          local_3e4 = local_3e4 + iVar52;
                          local_3e0 = local_3e0 + iVar52;
                          local_3dc = local_3dc + iVar52;
                          local_3d8 = local_3d8 + iVar51;
                          local_3d4 = local_3d4 + iVar51;
                          local_3d0 = local_3d0 + iVar51;
                          local_3cc = local_3cc + iVar51;
                          bVar96 = iVar19 != iVar83;
                          iVar19 = iVar19 + uVar84;
                        } while (bVar96);
                      }
                      local_4c4 = local_4c4 + iVar6 * sweeper.dims_b.ncell_x * 0x40 * uVar78;
                      local_408 = local_408 + iVar34;
                      local_404 = local_404 + iVar34;
                      local_400 = local_400 + iVar34;
                      local_3fc = local_3fc + iVar34;
                      local_3f8 = local_3f8 + iVar33;
                      local_3f4 = local_3f4 + iVar33;
                      local_3f0 = local_3f0 + iVar33;
                      local_3ec = local_3ec + iVar33;
                      bVar96 = iVar18 != iVar79;
                      iVar18 = iVar18 + uVar78;
                    } while (bVar96);
                  }
                  iVar86 = iVar86 + 1;
                  local_4c8 = local_4c8 + sweeper.dims_b.ncell_y * sweeper.dims_b.ncell_x * 0x40;
                  local_418 = local_418 + iVar89;
                  local_41c = local_41c + iVar89;
                  local_420 = local_420 + iVar89;
                  uVar55 = uVar55 + iVar89;
                  local_424 = local_424 + iVar27;
                  local_428 = local_428 + iVar27;
                  local_42c = local_42c + iVar27;
                  uVar65 = uVar65 + iVar27;
                  local_40c = local_40c + iVar26;
                  local_410 = local_410 + iVar26;
                  local_414 = local_414 + iVar26;
                  uVar16 = uVar16 + iVar26;
                } while (iVar86 != iVar85);
              }
              local_4bc = local_4bc + 1;
            } while (local_4bc != uVar15);
          }
          uVar77 = uVar77 + 1;
          iVar40 = iVar40 + iVar6;
          iVar57 = iVar57 + iVar88;
          iVar58 = iVar58 + iVar88;
          iVar59 = iVar59 + iVar88;
          iVar41 = iVar41 + iVar6;
        } while (uVar77 != ((long)sweeper.noctant_per_block / (long)sweeper.nthread_octant &
                           0xffffffffU));
      }
      lVar73 = lVar73 + 1;
    } while (lVar73 != sweeper.nsemiblock);
  }
  return;
}

Assistant:

TARGET_HD void Sweeper_sweep_block_impl(
  SweeperLite            sweeper,
        P* __restrict__  vo,
  const P* __restrict__  vi,
        P* __restrict__  facexy,
        P* __restrict__  facexz,
        P* __restrict__  faceyz,
  const P* __restrict__  a_from_m,
  const P* __restrict__  m_from_a,
  int                    step,
  const Quantities       quan,
  Bool_t                 proc_x_min,
  Bool_t                 proc_x_max,
  Bool_t                 proc_y_min,
  Bool_t                 proc_y_max,
  StepInfoAll            stepinfoall,
  unsigned long int      do_block_init )
{
  /*---Declarations---*/
    const int noctant_per_block = sweeper.noctant_per_block;

    const int nsemiblock = sweeper.nsemiblock;

    int semiblock_step = 0;

    /*=========================================================================
    =    OpenMP-parallelizing octants leads to the problem that for the same
    =    step, two octants may be updating the same location in a state vector.
    =
    =    One solution is to make the state vector update atomic, which is
    =    likely to be inefficient depending on the system.
    =
    =    The alternative used here is to break the step into sub steps
    =    and break the block into subregions such that during a sub-step,
    =    different octants in different threads update disjoint subregions.
    =
    =    First, note that octants are assigned to threads as follows:
    =      nthread_octant==1: one thread for all octants.
    =      nthread_octant==2: -x and +x octants assigned to different threads.
    =      nthread_octant==4: -y and +y octants also have different threads.
    =      nthread_octant==8: -z and +z octants also have different threads.
    =
    =    Along each coordinate axis for which two threads are assigned,
    =    the block is divided into two halves.  This gives a set of semiblocks.
    =
    =    The semiblocks are visited by the semiblock loop in an ordering
    =    which is lexicographical, either forward or reverse direction
    =    depending on the direction specified by that octant along the axis.
    =    This is set up so that (1) the disjointness condition described
    =    above holds, and (2) the cells are visited in an order that
    =    satisfies the sweep recursion.
    =
    =    NOTES:
    =    - For the unthreaded case, nsemiblock and noctant_per_block
    =      can be set to any of the allowed values and the algorithm will
    =      work properly.
    =    - If nsemiblock==noctant_per_block, then any value of nthread_octant
    =      applied to the OpenMP loop will work ok.
    =    - If nsemiblock<noctant_per_block==nthread_octant, then
    =      a potential race condition will occur.  This can be fixed by
    =      making the update of vo at the end of Sweeper_sweep_semiblock atomic.
    =      What is in question here is the overhead of the semiblock loop.
    =      One might want to reduce the number of semiblocks while keeping
    =      noctant_per_block==nthread_octant high to get more thread
    =      parallelism but possibly not too high so as to control the
    =      wavefront latency.
    =========================================================================*/

    /*--------------------*/
    /*---Loop over semiblock steps---*/
    /*--------------------*/

    for( semiblock_step=0; semiblock_step<nsemiblock; ++semiblock_step )
    {
#ifdef USE_OPENMP_TASKS
      /*--------------------*/
      /*---Enter parallel region where tasks will be launched---*/
      /*--------------------*/

      int thread_octant = 0;
      int thread_e = 0;

#pragma omp parallel for firstprivate(sweeper) collapse(2)
      for( thread_octant=0; thread_octant<sweeper.nthread_octant;
                                                             ++thread_octant)
      {
      for( thread_e=0; thread_e<sweeper.nthread_e; ++thread_e)
      {
        sweeper.thread_octant = thread_octant;
        sweeper.thread_e = thread_e;

      /*--------------------*/
      /*---Loop over the space of all tasks to be launched---*/
      /*--------------------*/

      /*---Here we assign one thread/task per subblock---*/

      int thread_z = 0;
      for( thread_z=0; thread_z<sweeper.nthread_z; ++thread_z)
      {
        sweeper.thread_z = thread_z;

      int thread_y = 0;
      for( thread_y=0; thread_y<sweeper.nthread_y; ++thread_y)
      {
        sweeper.thread_y = thread_y;

      int thread_x = 0;
      for( thread_x=0; thread_x<sweeper.nthread_x; ++thread_x)
      {
        sweeper.thread_x = thread_x;

      /*--------------------*/
      /*---Determine dependencies---*/
      /*--------------------*/

      const char* __restrict__ dep_in_x = Sweeper_task_dependency( &sweeper,
                thread_x-1, thread_y,   thread_z,   thread_e, thread_octant );

      const char* __restrict__ dep_in_y = Sweeper_task_dependency( &sweeper,
                thread_x,   thread_y-1, thread_z,   thread_e, thread_octant );

      const char* __restrict__ dep_in_z = Sweeper_task_dependency( &sweeper,
                thread_x,   thread_y,   thread_z-1, thread_e, thread_octant );

      const char* __restrict__ dep_out = Sweeper_task_dependency( &sweeper,
                thread_x,   thread_y,   thread_z,   thread_e, thread_octant );

      /*
        printf("%i %i "
               "Submitting task %i %i %i %i %i  thread %i numthreads %i\n",
               step, semiblock_step,
               thread_x, thread_y, thread_z, thread_e, thread_octant,
               omp_get_thread_num(), omp_get_num_threads());
      */

      /*--------------------*/
      /*---Launch this task---*/
      /*--------------------*/

#pragma omp task \
      depend(in:  dep_in_x[0]) \
      depend(in:  dep_in_y[0]) \
      depend(in:  dep_in_z[0]) \
      depend(out: dep_out[0])
      {
      /*
        printf("%i %i                   "
               "Commencing task %i %i %i %i %i  thread %i\n",
               step, semiblock_step,
               thread_x, thread_y, thread_z, thread_e, thread_octant,
               omp_get_thread_num());
      */
#endif

      /*--------------------*/
      /*---Loop over octants in octant block---*/
      /*---That is, octants that are computed for this semiblock step---*/
      /*--------------------*/

        const int octant_in_block_min =
                             (   sweeper.noctant_per_block *
                               ( Sweeper_thread_octant( &sweeper )     ) )
                           /     sweeper.nthread_octant;
        const int octant_in_block_max =
                             (   sweeper.noctant_per_block *
                               ( Sweeper_thread_octant( &sweeper ) + 1 ) )
                           /     sweeper.nthread_octant;

        int octant_in_block = 0;

      for( octant_in_block=octant_in_block_min;
           octant_in_block<octant_in_block_max; ++octant_in_block )
      {
        /*---Get step info---*/

        const StepInfo stepinfo = stepinfoall.stepinfo[octant_in_block];

        const Bool_t is_octant_active = stepinfo.is_active;

        const int dir_x = Dir_x( stepinfo.octant );
        const int dir_y = Dir_y( stepinfo.octant );
        const int dir_z = Dir_z( stepinfo.octant );

        /*--------------------*/
        /*---Compute semiblock bounds---*/
        /*--------------------*/

        Bool_t is_semiblock_min_x = 0, is_semiblock_max_x = 0;
        int ixmin_semiblock = 0, ixmax_semiblock = 0, ixmax_semiblock_up2 = 0;

        Sweeper_get_semiblock_bounds(&is_semiblock_min_x, &is_semiblock_max_x,
          &ixmin_semiblock, &ixmax_semiblock, &ixmax_semiblock_up2,
          sweeper.dims_b.ncell_x, DIM_X, dir_x, semiblock_step, nsemiblock);

        /*--------------------*/

        Bool_t is_semiblock_min_y = 0, is_semiblock_max_y = 0;
        int iymin_semiblock = 0, iymax_semiblock = 0, iymax_semiblock_up2 = 0;

        Sweeper_get_semiblock_bounds(&is_semiblock_min_y, &is_semiblock_max_y,
          &iymin_semiblock, &iymax_semiblock, &iymax_semiblock_up2,
          sweeper.dims_b.ncell_y, DIM_Y, dir_y, semiblock_step, nsemiblock);

        /*--------------------*/

        Bool_t is_semiblock_min_z = 0, is_semiblock_max_z = 0;
        int izmin_semiblock = 0, izmax_semiblock = 0, izmax_semiblock_up2 = 0;

        Sweeper_get_semiblock_bounds(&is_semiblock_min_z, &is_semiblock_max_z,
          &izmin_semiblock, &izmax_semiblock, &izmax_semiblock_up2,
          sweeper.dims_b.ncell_z, DIM_Z, dir_z, semiblock_step, nsemiblock);

        /*--------------------*/
        /*---Perform sweep over subblocks in semiblock---*/
        /*---(for tasking case, this task sweeps one subblock in semiblock---*/
        /*--------------------*/

        const int iz_base = stepinfo.block_z * sweeper.dims_b.ncell_z;

        const P* vi_this = const_ref_state( vi, sweeper.dims, NU, 0, 0,
                                                            iz_base, 0, 0, 0 );
        P* vo_this =             ref_state( vo, sweeper.dims, NU, 0, 0,
                                                            iz_base, 0, 0, 0 );

        const int do_block_init_this = !! ( do_block_init &
                         ( ((unsigned long int)1) <<
                           ( octant_in_block + noctant_per_block *
                             semiblock_step ) ) );

        Sweeper_sweep_semiblock( &sweeper, vo_this, vi_this,
                                 facexy, facexz, faceyz,
                                 a_from_m, m_from_a,
                                 &quan, stepinfo, octant_in_block,
                                 ixmin_semiblock, ixmax_semiblock_up2,
                                 iymin_semiblock, iymax_semiblock_up2,
                                 izmin_semiblock, izmax_semiblock_up2,
                                 do_block_init_this,
                                 is_octant_active );

      } /*---octant_in_block---*/

#ifdef USE_OPENMP_TASKS
      /*
        printf("%i %i                                                 "
               "Completing task %i %i %i %i %i  thread %i\n",
               step, semiblock_step,
               thread_x, thread_y, thread_z, thread_e, thread_octant,
               omp_get_thread_num());
      */

      } /*---omp task---*/
      }
      }
      }
      }
      } /*---omp parallel for---*/ /*---NOTE: implicit sync here---*/
#else
      /*---Sync between semiblock steps---*/
      Sweeper_sync_octant_threads( &sweeper );
#endif

    } /*---semiblock---*/
}